

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool __thiscall libcellml::Model::isDefined(Model *this)

{
  EntityImpl *pEVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  ComponentEntity local_30;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  if (pEVar1[4].mId.field_2._M_allocated_capacity == pEVar1[4].mId._M_string_length) {
    bVar2 = true;
  }
  else {
    uVar4 = 1;
    do {
      units((Model *)&local_30,(size_t)this);
      bVar2 = Units::isDefined((Units *)local_30.super_NamedEntity.super_ParentedEntity.super_Entity
                                        ._vptr_Entity);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               mPimpl;
      bVar5 = uVar4 < (ulong)((long)(pEVar1[4].mId.field_2._M_allocated_capacity -
                                    pEVar1[4].mId._M_string_length) >> 4);
      uVar4 = uVar4 + 1;
    } while (bVar2 && bVar5);
  }
  sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
  if ((bVar2 != false) && (sVar3 != 0)) {
    uVar4 = 1;
    do {
      ComponentEntity::component(&local_30,(size_t)this);
      bVar2 = Component::isDefined
                        ((Component *)
                         local_30.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
      bVar5 = uVar4 < sVar3;
      uVar4 = uVar4 + 1;
    } while (bVar2 && bVar5);
  }
  return bVar2;
}

Assistant:

bool Model::isDefined() const
{
    bool defined = true;
    for (size_t index = 0; (index < unitsCount()) && defined; ++index) {
        defined = units(index)->isDefined();
    }
    for (size_t index = 0; (index < componentCount()) && defined; ++index) {
        defined = component(index)->isDefined();
    }
    return defined;
}